

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void __thiscall pybind11::arg_v::arg_v<double>(arg_v *this,arg *base,double *x,char *descr)

{
  undefined8 uVar1;
  PyObject *pPVar2;
  allocator local_19;
  
  uVar1 = *(undefined8 *)&base->field_0x8;
  (this->super_arg).name = base->name;
  *(undefined8 *)&(this->super_arg).field_0x8 = uVar1;
  pPVar2 = (PyObject *)PyFloat_FromDouble(SUB84(*x,0));
  (this->value).super_handle.m_ptr = pPVar2;
  this->descr = descr;
  std::__cxx11::string::string
            ((string *)&this->type,_PyUnicode_AsUTF8String + (*_PyUnicode_AsUTF8String == '*'),
             &local_19);
  detail::clean_type_id(&this->type);
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    { }